

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O3

void __thiscall Expr::Expr(Expr *this,Expr *index,CaseExprList *cases)

{
  string *this_00;
  CaseExprList *pCVar1;
  CaseExpr *pCVar2;
  pointer ppCVar3;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  Object *local_58;
  string local_50;
  
  Object::Object(&this->super_Object);
  local_58 = &this->super_Object;
  DataDepElement::DataDepElement(&this->super_DataDepElement,EXPR);
  (this->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Expr_00144bb0;
  local_60 = &(this->str_).field_2;
  (this->str_)._M_dataplus._M_p = (pointer)local_60;
  (this->str_)._M_string_length = 0;
  (this->str_).field_2._M_local_buf[0] = '\0';
  this_00 = &this->orig_;
  local_68 = &(this->orig_).field_2;
  (this->orig_)._M_dataplus._M_p = (pointer)local_68;
  (this->orig_)._M_string_length = 0;
  (this->orig_).field_2._M_local_buf[0] = '\0';
  this->operand_[1] = (Expr *)0x0;
  this->operand_[2] = (Expr *)0x0;
  this->id_ = (ID *)0x0;
  this->num_ = (Number *)0x0;
  this->cstr_ = (ConstString *)0x0;
  this->regex_ = (RegEx *)0x0;
  this->args_ = (ExprList *)0x0;
  this->expr_type_ = EXPR_CASE;
  this->num_operands_ = -1;
  this->operand_[0] = index;
  this->cases_ = cases;
  strfmt_abi_cxx11_(&local_88,"case %s of { ",(index->orig_)._M_dataplus._M_p);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pCVar1 = this->cases_;
  if ((pCVar1 != (CaseExprList *)0x0) &&
     (ppCVar3 = (pCVar1->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
     ppCVar3 !=
     (pCVar1->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      pCVar2 = *ppCVar3;
      OrigExprList_abi_cxx11_(&local_50,pCVar2->index_);
      strfmt_abi_cxx11_(&local_88,"%s => %s; ",local_50._M_dataplus._M_p,
                        (pCVar2->value_->orig_)._M_dataplus._M_p);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_88._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 !=
             (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)this_00);
  return;
}

Assistant:

Expr::Expr(Expr* index, CaseExprList* cases) : DataDepElement(EXPR)
	{
	init();
	expr_type_ = EXPR_CASE;
	num_operands_ = -1;
	operand_[0] = index;
	cases_ = cases;

	orig_ = strfmt("case %s of { ", index->orig());
	foreach (i, CaseExprList, cases_)
		{
		CaseExpr* c = *i;
		orig_ += strfmt("%s => %s; ", OrigExprList(c->index()).c_str(), c->value()->orig());
		}
	orig_ += "}";
	}